

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_convert_nhdr2nim(nifti_1_header nhdr,char *fname)

{
  mat44 mat;
  mat44 mat_00;
  mat44 R;
  mat44 R_00;
  int iVar1;
  mat44 *pmVar2;
  undefined8 in_stack_fffffffffffffd88;
  bool local_26d;
  float local_26c;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  bool local_20d;
  int local_20c;
  undefined8 local_200 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [8];
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined1 local_180 [64];
  undefined1 local_140 [8];
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100 [64];
  undefined8 local_c0 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  mat44 local_7c;
  byte local_39;
  nifti_image *pnStack_38;
  uchar c;
  nifti_image *nim;
  int local_28;
  int is_onefile;
  int is_nifti;
  int ioff;
  int doswap;
  int ii;
  char *fname_local;
  
  _doswap = fname;
  pnStack_38 = (nifti_image *)calloc(1,0x2b8);
  if (pnStack_38 == (nifti_image *)0x0) {
    fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","failed to allocate nifti image");
    fname_local = (char *)0x0;
  }
  else {
    pnStack_38->fname = (char *)0x0;
    pnStack_38->iname = (char *)0x0;
    pnStack_38->data = (void *)0x0;
    is_nifti = need_nhdr_swap(nhdr.dim[0],nhdr.sizeof_hdr);
    if (is_nifti < 0) {
      free(pnStack_38);
      if (is_nifti == -1) {
        fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","bad dim[0]");
        fname_local = (char *)0x0;
      }
      else {
        fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","bad sizeof_hdr");
        fname_local = (char *)0x0;
      }
    }
    else {
      if ((((nhdr.magic[0] == 'n') && (nhdr.magic[3] == '\0')) &&
          ((nhdr.magic[1] == 'i' || (nhdr.magic[1] == '+')))) &&
         (('0' < nhdr.magic[2] && (nhdr.magic[2] < ':')))) {
        local_20c = nhdr.magic[2] + -0x30;
      }
      else {
        local_20c = 0;
      }
      local_28 = local_20c;
      if (local_20c == 0) {
        local_39 = (byte)nhdr.qform_code;
        pnStack_38->analyze75_orient = (uint)(byte)nhdr.qform_code;
      }
      if (is_nifti != 0) {
        if (3 < g_opts.debug) {
          disp_nifti_1_header("-d ni1 pre-swap: ",&nhdr);
        }
        swap_nifti_header(&nhdr,local_28);
      }
      if (2 < g_opts.debug) {
        disp_nifti_1_header("-d nhdr2nim : ",&nhdr);
      }
      if ((nhdr.datatype == 1) || (nhdr.datatype == 0)) {
        free(pnStack_38);
        fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","bad datatype");
        fname_local = (char *)0x0;
      }
      else if (nhdr.dim[1] < 1) {
        free(pnStack_38);
        fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","bad dim[1]");
        fname_local = (char *)0x0;
      }
      else {
        for (ioff = 2; ioff <= nhdr.dim[0]; ioff = ioff + 1) {
          if (nhdr.dim[ioff] < 1) {
            nhdr.dim[ioff] = 1;
          }
        }
        ioff = (int)nhdr.dim[0];
        while (ioff = ioff + 1, ioff < 8) {
          if ((nhdr.dim[ioff] != 1) && (nhdr.dim[ioff] != 0)) {
            nhdr.dim[ioff] = 1;
          }
        }
        for (ioff = 1; ioff <= nhdr.dim[0]; ioff = ioff + 1) {
          if (((nhdr.pixdim[ioff] == 0.0) && (!NAN(nhdr.pixdim[ioff]))) ||
             (0x7f7fffff < (uint)ABS(nhdr.pixdim[ioff]))) {
            nhdr.pixdim[ioff] = 1.0;
          }
        }
        local_20d = false;
        if (local_28 != 0) {
          local_20d = nhdr.magic[1] == '+';
        }
        nim._4_4_ = (uint)local_20d;
        if (local_28 == 0) {
          pnStack_38->nifti_type = 0;
        }
        else {
          iVar1 = 2;
          if (nim._4_4_ != 0) {
            iVar1 = 1;
          }
          pnStack_38->nifti_type = iVar1;
        }
        iVar1 = nifti_short_order();
        if (is_nifti == 0) {
          pnStack_38->byteorder = iVar1;
        }
        else {
          pnStack_38->byteorder = 3 - iVar1;
        }
        pnStack_38->dim[0] = (int)nhdr.dim[0];
        pnStack_38->ndim = (int)nhdr.dim[0];
        pnStack_38->dim[1] = (int)nhdr.dim[1];
        pnStack_38->nx = (int)nhdr.dim[1];
        pnStack_38->dim[2] = (int)nhdr.dim[2];
        pnStack_38->ny = (int)nhdr.dim[2];
        pnStack_38->dim[3] = (int)nhdr.dim[3];
        pnStack_38->nz = (int)nhdr.dim[3];
        pnStack_38->dim[4] = (int)nhdr.dim[4];
        pnStack_38->nt = (int)nhdr.dim[4];
        pnStack_38->dim[5] = (int)nhdr.dim[5];
        pnStack_38->nu = (int)nhdr.dim[5];
        pnStack_38->dim[6] = (int)nhdr.dim[6];
        pnStack_38->nv = (int)nhdr.dim[6];
        pnStack_38->dim[7] = (int)nhdr.dim[7];
        pnStack_38->nw = (int)nhdr.dim[7];
        ioff = 1;
        pnStack_38->nvox = 1;
        for (; ioff <= nhdr.dim[0]; ioff = ioff + 1) {
          pnStack_38->nvox = (long)nhdr.dim[ioff] * pnStack_38->nvox;
        }
        pnStack_38->datatype = (int)nhdr.datatype;
        nifti_datatype_sizes(pnStack_38->datatype,&pnStack_38->nbyper,&pnStack_38->swapsize);
        if (pnStack_38->nbyper == 0) {
          free(pnStack_38);
          fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","bad datatype");
          fname_local = (char *)0x0;
        }
        else {
          pnStack_38->pixdim[1] = nhdr.pixdim[1];
          pnStack_38->dx = nhdr.pixdim[1];
          pnStack_38->pixdim[2] = nhdr.pixdim[2];
          pnStack_38->dy = nhdr.pixdim[2];
          pnStack_38->pixdim[3] = nhdr.pixdim[3];
          pnStack_38->dz = nhdr.pixdim[3];
          pnStack_38->pixdim[4] = nhdr.pixdim[4];
          pnStack_38->dt = nhdr.pixdim[4];
          pnStack_38->pixdim[5] = nhdr.pixdim[5];
          pnStack_38->du = nhdr.pixdim[5];
          pnStack_38->pixdim[6] = nhdr.pixdim[6];
          pnStack_38->dv = nhdr.pixdim[6];
          pnStack_38->pixdim[7] = nhdr.pixdim[7];
          pnStack_38->dw = nhdr.pixdim[7];
          if ((local_28 == 0) || (nhdr.qform_code < 1)) {
            (pnStack_38->qto_xyz).m[0][0] = pnStack_38->dx;
            (pnStack_38->qto_xyz).m[1][1] = pnStack_38->dy;
            (pnStack_38->qto_xyz).m[2][2] = pnStack_38->dz;
            (pnStack_38->qto_xyz).m[0][3] = 0.0;
            (pnStack_38->qto_xyz).m[0][2] = 0.0;
            (pnStack_38->qto_xyz).m[0][1] = 0.0;
            (pnStack_38->qto_xyz).m[1][3] = 0.0;
            (pnStack_38->qto_xyz).m[1][2] = 0.0;
            (pnStack_38->qto_xyz).m[1][0] = 0.0;
            (pnStack_38->qto_xyz).m[2][3] = 0.0;
            (pnStack_38->qto_xyz).m[2][1] = 0.0;
            (pnStack_38->qto_xyz).m[2][0] = 0.0;
            (pnStack_38->qto_xyz).m[3][2] = 0.0;
            (pnStack_38->qto_xyz).m[3][1] = 0.0;
            (pnStack_38->qto_xyz).m[3][0] = 0.0;
            (pnStack_38->qto_xyz).m[3][3] = 1.0;
            pnStack_38->qform_code = 0;
            if (1 < g_opts.debug) {
              fprintf(_stderr,"-d no qform provided\n");
            }
          }
          else {
            if ((uint)ABS(nhdr.quatern_b) < 0x7f800000) {
              local_214 = nhdr.quatern_b;
            }
            else {
              local_214 = 0.0;
            }
            pnStack_38->quatern_b = local_214;
            if ((uint)ABS(nhdr.quatern_c) < 0x7f800000) {
              local_218 = nhdr.quatern_c;
            }
            else {
              local_218 = 0.0;
            }
            pnStack_38->quatern_c = local_218;
            if ((uint)ABS(nhdr.quatern_d) < 0x7f800000) {
              local_21c = nhdr.quatern_d;
            }
            else {
              local_21c = 0.0;
            }
            pnStack_38->quatern_d = local_21c;
            if ((uint)ABS(nhdr.qoffset_x) < 0x7f800000) {
              local_220 = nhdr.qoffset_x;
            }
            else {
              local_220 = 0.0;
            }
            pnStack_38->qoffset_x = local_220;
            if ((uint)ABS(nhdr.qoffset_y) < 0x7f800000) {
              local_224 = nhdr.qoffset_y;
            }
            else {
              local_224 = 0.0;
            }
            pnStack_38->qoffset_y = local_224;
            if ((uint)ABS(nhdr.qoffset_z) < 0x7f800000) {
              local_228 = nhdr.qoffset_z;
            }
            else {
              local_228 = 0.0;
            }
            pnStack_38->qoffset_z = local_228;
            local_22c = -1.0;
            if (0.0 <= nhdr.pixdim[0]) {
              local_22c = 1.0;
            }
            pnStack_38->qfac = local_22c;
            pmVar2 = &pnStack_38->qto_xyz;
            nifti_quatern_to_mat44
                      (&local_7c,pnStack_38->quatern_b,pnStack_38->quatern_c,pnStack_38->quatern_d,
                       pnStack_38->qoffset_x,pnStack_38->qoffset_y,pnStack_38->qoffset_z,
                       pnStack_38->dx,pnStack_38->dy,pnStack_38->dz,pnStack_38->qfac);
            memcpy(pmVar2,&local_7c,0x40);
            pnStack_38->qform_code = (int)nhdr.qform_code;
            if (1 < g_opts.debug) {
              memcpy(local_c0,&pnStack_38->qto_xyz,0x40);
              mat.m[0][2] = (float)(int)local_c0[1];
              mat.m[0][0] = (float)(undefined4)local_c0[0];
              mat.m[0][1] = (float)local_c0[0]._4_4_;
              mat.m[0][3] = (float)(int)((ulong)local_c0[1] >> 0x20);
              mat.m[1][0] = (float)(undefined4)local_b0;
              mat.m[1][1] = (float)local_b0._4_4_;
              mat.m[1][2] = (float)(undefined4)uStack_a8;
              mat.m[1][3] = (float)uStack_a8._4_4_;
              mat.m[2][0] = (float)(undefined4)local_a0;
              mat.m[2][1] = (float)local_a0._4_4_;
              mat.m[2][2] = (float)(undefined4)uStack_98;
              mat.m[2][3] = (float)uStack_98._4_4_;
              mat.m[3][0] = (float)(undefined4)local_90;
              mat.m[3][1] = (float)local_90._4_4_;
              mat.m[3][2] = (float)(undefined4)uStack_88;
              mat.m[3][3] = (float)uStack_88._4_4_;
              nifti_disp_matrix_orient("-d qform orientations:\n",mat);
            }
          }
          pmVar2 = &pnStack_38->qto_ijk;
          memcpy(local_140,&pnStack_38->qto_xyz,0x40);
          R.m[0][2] = (float)(undefined4)local_130;
          R.m[0][3] = (float)local_130._4_4_;
          R.m[0][0] = (float)(undefined4)uStack_138;
          R.m[0][1] = (float)uStack_138._4_4_;
          R.m[1][0] = (float)(undefined4)uStack_128;
          R.m[1][1] = (float)uStack_128._4_4_;
          R.m[1][2] = (float)(undefined4)local_120;
          R.m[1][3] = (float)local_120._4_4_;
          R.m[2][0] = (float)(undefined4)uStack_118;
          R.m[2][1] = (float)uStack_118._4_4_;
          R.m[2][2] = (float)(undefined4)local_110;
          R.m[2][3] = (float)local_110._4_4_;
          R.m[3][0] = (float)(undefined4)uStack_108;
          R.m[3][1] = (float)uStack_108._4_4_;
          R.m[3][2] = (float)(int)in_stack_fffffffffffffd88;
          R.m[3][3] = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
          nifti_mat44_inverse(R);
          memcpy(pmVar2,local_100,0x40);
          if ((local_28 == 0) || (nhdr.sform_code < 1)) {
            pnStack_38->sform_code = 0;
            if (1 < g_opts.debug) {
              fprintf(_stderr,"-d no sform provided\n");
            }
          }
          else {
            (pnStack_38->sto_xyz).m[0][0] = nhdr.srow_x[0];
            (pnStack_38->sto_xyz).m[0][1] = nhdr.srow_x[1];
            (pnStack_38->sto_xyz).m[0][2] = nhdr.srow_x[2];
            (pnStack_38->sto_xyz).m[0][3] = nhdr.srow_x[3];
            (pnStack_38->sto_xyz).m[1][0] = nhdr.srow_y[0];
            (pnStack_38->sto_xyz).m[1][1] = nhdr.srow_y[1];
            (pnStack_38->sto_xyz).m[1][2] = nhdr.srow_y[2];
            (pnStack_38->sto_xyz).m[1][3] = nhdr.srow_y[3];
            (pnStack_38->sto_xyz).m[2][0] = nhdr.srow_z[0];
            (pnStack_38->sto_xyz).m[2][1] = nhdr.srow_z[1];
            (pnStack_38->sto_xyz).m[2][2] = nhdr.srow_z[2];
            (pnStack_38->sto_xyz).m[2][3] = nhdr.srow_z[3];
            (pnStack_38->sto_xyz).m[3][2] = 0.0;
            (pnStack_38->sto_xyz).m[3][1] = 0.0;
            (pnStack_38->sto_xyz).m[3][0] = 0.0;
            (pnStack_38->sto_xyz).m[3][3] = 1.0;
            pmVar2 = &pnStack_38->sto_ijk;
            memcpy(local_1c0,&pnStack_38->sto_xyz,0x40);
            R_00.m[0][2] = (float)(undefined4)local_1b0;
            R_00.m[0][3] = (float)local_1b0._4_4_;
            R_00.m[0][0] = (float)(undefined4)uStack_1b8;
            R_00.m[0][1] = (float)uStack_1b8._4_4_;
            R_00.m[1][0] = (float)(undefined4)uStack_1a8;
            R_00.m[1][1] = (float)uStack_1a8._4_4_;
            R_00.m[1][2] = (float)(undefined4)local_1a0;
            R_00.m[1][3] = (float)local_1a0._4_4_;
            R_00.m[2][0] = (float)(undefined4)uStack_198;
            R_00.m[2][1] = (float)uStack_198._4_4_;
            R_00.m[2][2] = (float)(undefined4)local_190;
            R_00.m[2][3] = (float)local_190._4_4_;
            R_00.m[3][0] = (float)(undefined4)uStack_188;
            R_00.m[3][1] = (float)uStack_188._4_4_;
            R_00.m[3][2] = (float)(int)in_stack_fffffffffffffd88;
            R_00.m[3][3] = (float)(int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
            nifti_mat44_inverse(R_00);
            memcpy(pmVar2,local_180,0x40);
            pnStack_38->sform_code = (int)nhdr.sform_code;
            if (1 < g_opts.debug) {
              memcpy(local_200,&pnStack_38->sto_xyz,0x40);
              mat_00.m[0][2] = (float)(int)local_200[1];
              mat_00.m[0][0] = (float)(undefined4)local_200[0];
              mat_00.m[0][1] = (float)local_200[0]._4_4_;
              mat_00.m[0][3] = (float)(int)((ulong)local_200[1] >> 0x20);
              mat_00.m[1][0] = (float)(undefined4)local_1f0;
              mat_00.m[1][1] = (float)local_1f0._4_4_;
              mat_00.m[1][2] = (float)(undefined4)uStack_1e8;
              mat_00.m[1][3] = (float)uStack_1e8._4_4_;
              mat_00.m[2][0] = (float)(undefined4)local_1e0;
              mat_00.m[2][1] = (float)local_1e0._4_4_;
              mat_00.m[2][2] = (float)(undefined4)uStack_1d8;
              mat_00.m[2][3] = (float)uStack_1d8._4_4_;
              mat_00.m[3][0] = (float)(undefined4)local_1d0;
              mat_00.m[3][1] = (float)local_1d0._4_4_;
              mat_00.m[3][2] = (float)(undefined4)uStack_1c8;
              mat_00.m[3][3] = (float)uStack_1c8._4_4_;
              nifti_disp_matrix_orient("-d sform orientations:\n",mat_00);
            }
          }
          if (local_28 != 0) {
            if ((uint)ABS(nhdr.scl_slope) < 0x7f800000) {
              local_24c = nhdr.scl_slope;
            }
            else {
              local_24c = 0.0;
            }
            pnStack_38->scl_slope = local_24c;
            if ((uint)ABS(nhdr.scl_inter) < 0x7f800000) {
              local_250 = nhdr.scl_inter;
            }
            else {
              local_250 = 0.0;
            }
            pnStack_38->scl_inter = local_250;
            pnStack_38->intent_code = (int)nhdr.intent_code;
            if ((uint)ABS(nhdr.intent_p1) < 0x7f800000) {
              local_254 = nhdr.intent_p1;
            }
            else {
              local_254 = 0.0;
            }
            pnStack_38->intent_p1 = local_254;
            if ((uint)ABS(nhdr.intent_p2) < 0x7f800000) {
              local_258 = nhdr.intent_p2;
            }
            else {
              local_258 = 0.0;
            }
            pnStack_38->intent_p2 = local_258;
            if ((uint)ABS(nhdr.intent_p3) < 0x7f800000) {
              local_25c = nhdr.intent_p3;
            }
            else {
              local_25c = 0.0;
            }
            pnStack_38->intent_p3 = local_25c;
            if ((uint)ABS(nhdr.toffset) < 0x7f800000) {
              local_260 = nhdr.toffset;
            }
            else {
              local_260 = 0.0;
            }
            pnStack_38->toffset = local_260;
            *(undefined8 *)pnStack_38->intent_name = nhdr.intent_name._0_8_;
            *(undefined4 *)(pnStack_38->intent_name + 8) = nhdr.intent_name._8_4_;
            *(undefined2 *)(pnStack_38->intent_name + 0xc) = nhdr.intent_name._12_2_;
            pnStack_38->intent_name[0xe] = nhdr.intent_name[0xe];
            pnStack_38->intent_name[0xf] = '\0';
            pnStack_38->xyz_units = (int)nhdr.xyzt_units & 7;
            pnStack_38->time_units = (int)nhdr.xyzt_units & 0x38;
            pnStack_38->freq_dim = (int)nhdr.dim_info & 3;
            pnStack_38->phase_dim = (int)nhdr.dim_info >> 2 & 3;
            pnStack_38->slice_dim = (int)nhdr.dim_info >> 4 & 3;
            pnStack_38->slice_code = (int)nhdr.slice_code;
            pnStack_38->slice_start = (int)nhdr.slice_start;
            pnStack_38->slice_end = (int)nhdr.slice_end;
            if ((uint)ABS(nhdr.slice_duration) < 0x7f800000) {
              local_264 = nhdr.slice_duration;
            }
            else {
              local_264 = 0.0;
            }
            pnStack_38->slice_duration = local_264;
          }
          if ((uint)ABS(nhdr.cal_min) < 0x7f800000) {
            local_268 = nhdr.cal_min;
          }
          else {
            local_268 = 0.0;
          }
          pnStack_38->cal_min = local_268;
          if ((uint)ABS(nhdr.cal_max) < 0x7f800000) {
            local_26c = nhdr.cal_max;
          }
          else {
            local_26c = 0.0;
          }
          pnStack_38->cal_max = local_26c;
          memcpy(pnStack_38->descrip,nhdr.descrip,0x4f);
          pnStack_38->descrip[0x4f] = '\0';
          *(undefined8 *)pnStack_38->aux_file = nhdr.aux_file._0_8_;
          *(undefined8 *)(pnStack_38->aux_file + 8) = nhdr.aux_file._8_8_;
          *(undefined4 *)(pnStack_38->aux_file + 0x10) = nhdr.aux_file._16_4_;
          *(undefined2 *)(pnStack_38->aux_file + 0x14) = nhdr.aux_file._20_2_;
          pnStack_38->aux_file[0x16] = nhdr.aux_file[0x16];
          pnStack_38->aux_file[0x17] = '\0';
          local_26d = false;
          if (local_28 != 0) {
            local_26d = nhdr.magic[1] == '+';
          }
          nim._4_4_ = (uint)local_26d;
          if (nim._4_4_ == 0) {
            is_onefile = (int)nhdr.vox_offset;
          }
          else {
            is_onefile = (int)nhdr.vox_offset;
            if (is_onefile < 0x15c) {
              is_onefile = 0x15c;
            }
          }
          pnStack_38->iname_offset = is_onefile;
          if (_doswap == (char *)0x0) {
            pnStack_38->fname = (char *)0x0;
            pnStack_38->iname = (char *)0x0;
          }
          else {
            nifti_set_filenames(pnStack_38,_doswap,0,0);
            if (pnStack_38->iname == (char *)0x0) {
              fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n","bad filename");
              return (nifti_image *)0x0;
            }
          }
          pnStack_38->num_ext = 0;
          pnStack_38->ext_list = (nifti1_extension *)0x0;
          fname_local = (char *)pnStack_38;
        }
      }
    }
  }
  return (nifti_image *)fname_local;
}

Assistant:

nifti_image* nifti_convert_nhdr2nim(struct nifti_1_header nhdr,
                                    const char * fname)
{
   int   ii , doswap , ioff ;
   int   is_nifti , is_onefile ;
   nifti_image *nim;

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ) ERREX("failed to allocate nifti image");

   /* be explicit with pointers */
   nim->fname = NULL;
   nim->iname = NULL;
   nim->data = NULL;

   /**- check if we must swap bytes */

   doswap = need_nhdr_swap(nhdr.dim[0], nhdr.sizeof_hdr); /* swap data flag */

   if( doswap < 0 ){
      free(nim);
      if( doswap == -1 ) ERREX("bad dim[0]") ;
      ERREX("bad sizeof_hdr") ;  /* else */
   }

   /**- determine if this is a NIFTI-1 compliant header */

   is_nifti = NIFTI_VERSION(nhdr) ;
   /*
    * before swapping header, record the Analyze75 orient code
    */
   if(!is_nifti)
     {
     /**- in analyze75, the orient code is at the same address as
      *   qform_code, but it's just one byte
      *   the qform_code will be zero, at which point you can check
      *   analyze75_orient if you care to.
      */
     unsigned char c = *((char *)(&nhdr.qform_code));
     nim->analyze75_orient = (analyze_75_orient_code)c;
     }
   if( doswap ) {
      if ( g_opts.debug > 3 ) disp_nifti_1_header("-d ni1 pre-swap: ", &nhdr);
      swap_nifti_header( &nhdr , is_nifti ) ;
   }

   if ( g_opts.debug > 2 ) disp_nifti_1_header("-d nhdr2nim : ", &nhdr);

   if( nhdr.datatype == DT_BINARY || nhdr.datatype == DT_UNKNOWN  )
   {
     free(nim);
     ERREX("bad datatype") ;
   }

   if( nhdr.dim[1] <= 0 )
   {
     free(nim);
     ERREX("bad dim[1]") ;
   }

   /* fix bad dim[] values in the defined dimension range */
   for( ii=2 ; ii <= nhdr.dim[0] ; ii++ )
     if( nhdr.dim[ii] <= 0 ) nhdr.dim[ii] = 1 ;

   /* fix any remaining bad dim[] values, so garbage does not propagate */
   /* (only values 0 or 1 seem rational, otherwise set to arbirary 1)   */
   for( ii=nhdr.dim[0]+1 ; ii <= 7 ; ii++ )
     if( nhdr.dim[ii] != 1 && nhdr.dim[ii] != 0) nhdr.dim[ii] = 1 ;

#if 0  /* rely on dim[0], do not attempt to modify it   16 Nov 2005 [rickr] */

   /**- get number of dimensions (ignoring dim[0] now) */
   for( ii=7 ; ii >= 2 ; ii-- )            /* loop backwards until we  */
     if( nhdr.dim[ii] > 1 ) break ;        /* find a dim bigger than 1 */
   ndim = ii ;
#endif

   /**- set bad grid spacings to 1.0 */

   for( ii=1 ; ii <= nhdr.dim[0] ; ii++ ){
     if( nhdr.pixdim[ii] == 0.0         ||
         !IS_GOOD_FLOAT(nhdr.pixdim[ii])  ) nhdr.pixdim[ii] = 1.0f ;
   }

  is_onefile = is_nifti && NIFTI_ONEFILE(nhdr) ;

  if( is_nifti ) nim->nifti_type = (is_onefile) ? NIFTI_FTYPE_NIFTI1_1
                                                : NIFTI_FTYPE_NIFTI1_2 ;
  else           nim->nifti_type = NIFTI_FTYPE_ANALYZE ;

  ii = nifti_short_order() ;
  if( doswap )   nim->byteorder = REVERSE_ORDER(ii) ;
  else           nim->byteorder = ii ;


  /**- set dimensions of data array */

  nim->ndim = nim->dim[0] = nhdr.dim[0];
  nim->nx   = nim->dim[1] = nhdr.dim[1];
  nim->ny   = nim->dim[2] = nhdr.dim[2];
  nim->nz   = nim->dim[3] = nhdr.dim[3];
  nim->nt   = nim->dim[4] = nhdr.dim[4];
  nim->nu   = nim->dim[5] = nhdr.dim[5];
  nim->nv   = nim->dim[6] = nhdr.dim[6];
  nim->nw   = nim->dim[7] = nhdr.dim[7];

  for( ii=1, nim->nvox=1; ii <= nhdr.dim[0]; ii++ )
     nim->nvox *= nhdr.dim[ii];

  /**- set the type of data in voxels and how many bytes per voxel */

  nim->datatype = nhdr.datatype ;

  nifti_datatype_sizes( nim->datatype , &(nim->nbyper) , &(nim->swapsize) ) ;
  if( nim->nbyper == 0 ){ free(nim); ERREX("bad datatype"); }

  /**- set the grid spacings */

  nim->dx = nim->pixdim[1] = nhdr.pixdim[1] ;
  nim->dy = nim->pixdim[2] = nhdr.pixdim[2] ;
  nim->dz = nim->pixdim[3] = nhdr.pixdim[3] ;
  nim->dt = nim->pixdim[4] = nhdr.pixdim[4] ;
  nim->du = nim->pixdim[5] = nhdr.pixdim[5] ;
  nim->dv = nim->pixdim[6] = nhdr.pixdim[6] ;
  nim->dw = nim->pixdim[7] = nhdr.pixdim[7] ;

  /**- compute qto_xyz transformation from pixel indexes (i,j,k) to (x,y,z) */

  if( !is_nifti || nhdr.qform_code <= 0 ){
    /**- if not nifti or qform_code <= 0, use grid spacing for qto_xyz */

    nim->qto_xyz.m[0][0] = nim->dx ;  /* grid spacings */
    nim->qto_xyz.m[1][1] = nim->dy ;  /* along diagonal */
    nim->qto_xyz.m[2][2] = nim->dz ;

    /* off diagonal is zero */

    nim->qto_xyz.m[0][1]=nim->qto_xyz.m[0][2]=nim->qto_xyz.m[0][3] = 0.0f;
    nim->qto_xyz.m[1][0]=nim->qto_xyz.m[1][2]=nim->qto_xyz.m[1][3] = 0.0f;
    nim->qto_xyz.m[2][0]=nim->qto_xyz.m[2][1]=nim->qto_xyz.m[2][3] = 0.0f;

    /* last row is always [ 0 0 0 1 ] */

    nim->qto_xyz.m[3][0]=nim->qto_xyz.m[3][1]=nim->qto_xyz.m[3][2] = 0.0f;
    nim->qto_xyz.m[3][3]= 1.0f ;

    nim->qform_code = NIFTI_XFORM_UNKNOWN ;

    if( g_opts.debug > 1 ) fprintf(stderr,"-d no qform provided\n");
  } else {
    /**- else NIFTI: use the quaternion-specified transformation */

    nim->quatern_b = FIXED_FLOAT( nhdr.quatern_b ) ;
    nim->quatern_c = FIXED_FLOAT( nhdr.quatern_c ) ;
    nim->quatern_d = FIXED_FLOAT( nhdr.quatern_d ) ;

    nim->qoffset_x = FIXED_FLOAT(nhdr.qoffset_x) ;
    nim->qoffset_y = FIXED_FLOAT(nhdr.qoffset_y) ;
    nim->qoffset_z = FIXED_FLOAT(nhdr.qoffset_z) ;

    nim->qfac = (nhdr.pixdim[0] < 0.0) ? -1.0f : 1.0f ;  /* left-handedness? */

    nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;

    nim->qform_code = nhdr.qform_code ;

    if( g_opts.debug > 1 )
       nifti_disp_matrix_orient("-d qform orientations:\n", nim->qto_xyz);
  }

  /**- load inverse transformation (x,y,z) -> (i,j,k) */

  nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

  /**- load sto_xyz affine transformation, if present */

  if( !is_nifti || nhdr.sform_code <= 0 ){
    /**- if not nifti or sform_code <= 0, then no sto transformation */

    nim->sform_code = NIFTI_XFORM_UNKNOWN ;

    if( g_opts.debug > 1 ) fprintf(stderr,"-d no sform provided\n");

  } else {
    /**- else set the sto transformation from srow_*[] */

    nim->sto_xyz.m[0][0] = nhdr.srow_x[0] ;
    nim->sto_xyz.m[0][1] = nhdr.srow_x[1] ;
    nim->sto_xyz.m[0][2] = nhdr.srow_x[2] ;
    nim->sto_xyz.m[0][3] = nhdr.srow_x[3] ;

    nim->sto_xyz.m[1][0] = nhdr.srow_y[0] ;
    nim->sto_xyz.m[1][1] = nhdr.srow_y[1] ;
    nim->sto_xyz.m[1][2] = nhdr.srow_y[2] ;
    nim->sto_xyz.m[1][3] = nhdr.srow_y[3] ;

    nim->sto_xyz.m[2][0] = nhdr.srow_z[0] ;
    nim->sto_xyz.m[2][1] = nhdr.srow_z[1] ;
    nim->sto_xyz.m[2][2] = nhdr.srow_z[2] ;
    nim->sto_xyz.m[2][3] = nhdr.srow_z[3] ;

    /* last row is always [ 0 0 0 1 ] */

    nim->sto_xyz.m[3][0]=nim->sto_xyz.m[3][1]=nim->sto_xyz.m[3][2] = 0.0f;
    nim->sto_xyz.m[3][3]= 1.0f ;

    nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

    nim->sform_code = nhdr.sform_code ;

    if( g_opts.debug > 1 )
       nifti_disp_matrix_orient("-d sform orientations:\n", nim->sto_xyz);
  }

  /**- set miscellaneous NIFTI stuff */

  if( is_nifti ){
    nim->scl_slope   = FIXED_FLOAT( nhdr.scl_slope ) ;
    nim->scl_inter   = FIXED_FLOAT( nhdr.scl_inter ) ;

    nim->intent_code = nhdr.intent_code ;

    nim->intent_p1 = FIXED_FLOAT( nhdr.intent_p1 ) ;
    nim->intent_p2 = FIXED_FLOAT( nhdr.intent_p2 ) ;
    nim->intent_p3 = FIXED_FLOAT( nhdr.intent_p3 ) ;

    nim->toffset   = FIXED_FLOAT( nhdr.toffset ) ;

    memcpy(nim->intent_name,nhdr.intent_name,15); nim->intent_name[15] = '\0';

    nim->xyz_units  = XYZT_TO_SPACE(nhdr.xyzt_units) ;
    nim->time_units = XYZT_TO_TIME (nhdr.xyzt_units) ;

    nim->freq_dim  = DIM_INFO_TO_FREQ_DIM ( nhdr.dim_info ) ;
    nim->phase_dim = DIM_INFO_TO_PHASE_DIM( nhdr.dim_info ) ;
    nim->slice_dim = DIM_INFO_TO_SLICE_DIM( nhdr.dim_info ) ;

    nim->slice_code     = nhdr.slice_code  ;
    nim->slice_start    = nhdr.slice_start ;
    nim->slice_end      = nhdr.slice_end   ;
    nim->slice_duration = FIXED_FLOAT(nhdr.slice_duration) ;
  }

  /**- set Miscellaneous ANALYZE stuff */

  nim->cal_min = FIXED_FLOAT(nhdr.cal_min) ;
  nim->cal_max = FIXED_FLOAT(nhdr.cal_max) ;

  memcpy(nim->descrip ,nhdr.descrip ,79) ; nim->descrip [79] = '\0' ;
  memcpy(nim->aux_file,nhdr.aux_file,23) ; nim->aux_file[23] = '\0' ;

   /**- set ioff from vox_offset (but at least sizeof(header)) */

   is_onefile = is_nifti && NIFTI_ONEFILE(nhdr) ;

   if( is_onefile ){
     ioff = (int)nhdr.vox_offset ;
     if( ioff < (int) sizeof(nhdr) ) ioff = (int) sizeof(nhdr) ;
   } else {
     ioff = (int)nhdr.vox_offset ;
   }
   nim->iname_offset = ioff ;


   /**- deal with file names if set */
   if (fname!=NULL) {
       nifti_set_filenames(nim,fname,0,0);
       if (nim->iname==NULL)  { ERREX("bad filename"); }
   } else {
     nim->fname = NULL;
     nim->iname = NULL;
   }

   /* clear extension fields */
   nim->num_ext = 0;
   nim->ext_list = NULL;

   return nim;
}